

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

bool __thiscall sptk::reaper::EpochTracker::ComputePolarity(EpochTracker *this,int *polarity)

{
  bool bVar1;
  undefined4 *in_RSI;
  long in_RDI;
  float mean;
  float *in_stack_00000020;
  vector<float,_std::allocator<float>_> *in_stack_00000028;
  EpochTracker *in_stack_00000030;
  vector<float,_std::allocator<float>_> *in_stack_000000c0;
  float in_stack_000000cc;
  float in_stack_000000d0;
  float in_stack_000000d4;
  float in_stack_000000d8;
  float in_stack_000000dc;
  vector<float,_std::allocator<float>_> *in_stack_000000e0;
  EpochTracker *in_stack_000000e8;
  vector<float,_std::allocator<float>_> *in_stack_00000150;
  float in_stack_0000015c;
  vector<float,_std::allocator<float>_> *in_stack_00000160;
  EpochTracker *in_stack_00000168;
  bool local_1;
  
  if (0.0 < *(float *)(in_RDI + 0x128)) {
    bVar1 = GetBandpassedRmsSignal
                      (in_stack_000000e8,in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,
                       in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c0);
    if (bVar1) {
      bVar1 = GetLpcResidual(in_stack_00000168,in_stack_00000160,in_stack_0000015c,in_stack_00000150
                            );
      if (bVar1) {
        GetSymmetryStats(in_stack_00000030,in_stack_00000028,in_stack_00000020,(float *)this,
                         (float *)polarity);
        *in_RSI = 0xffffffff;
        if (*(float *)(in_RDI + 0x130) <= *(float *)(in_RDI + 300) &&
            *(float *)(in_RDI + 300) != *(float *)(in_RDI + 0x130)) {
          *in_RSI = 1;
        }
        local_1 = true;
      }
      else {
        fprintf(_stderr,"Failure in GetLpcResidual\n");
        local_1 = false;
      }
    }
    else {
      fprintf(_stderr,"Failure in GetBandpassedRmsSignal\n");
      local_1 = false;
    }
  }
  else {
    fprintf(_stderr,"EpochTracker not initialized in ComputeFeatures\n");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool EpochTracker::ComputePolarity(int *polarity) {
  if (sample_rate_ <= 0.0) {
    fprintf(stderr, "EpochTracker not initialized in ComputeFeatures\n");
    return false;
  }
  if (!GetBandpassedRmsSignal(signal_, sample_rate_, min_freq_for_rms_,
                              max_freq_for_rms_, internal_frame_interval_,
                              rms_window_dur_, &bandpassed_rms_)) {
    fprintf(stderr, "Failure in GetBandpassedRmsSignal\n");
    return false;
  }
  if (!GetLpcResidual(signal_, sample_rate_, &residual_)) {
    fprintf(stderr, "Failure in GetLpcResidual\n");
    return false;
  }
  float mean = 0.0;
  GetSymmetryStats(residual_, &positive_rms_, &negative_rms_, &mean);
  *polarity = -1;
  if (positive_rms_ > negative_rms_) {
    *polarity = 1;
  }
  return true;
}